

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int pulse_stream_set_name(cubeb_stream_conflict *stm,char *stream_name)

{
  int iVar1;
  pa_operation *o;
  
  iVar1 = -1;
  if ((stm != (cubeb_stream_conflict *)0x0) && (iVar1 = -1, stm->output_stream != (pa_stream *)0x0))
  {
    (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
    o = (*cubeb_pa_stream_set_name)(stm->output_stream,stream_name,rename_success,stm);
    if (o != (pa_operation *)0x0) {
      operation_wait(stm->context,stm->output_stream,o);
      (*cubeb_pa_operation_unref)(o);
    }
    (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
pulse_stream_set_name(cubeb_stream * stm, char const * stream_name)
{
  if (!stm || !stm->output_stream) {
    return CUBEB_ERROR;
  }

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);

  pa_operation * op = WRAP(pa_stream_set_name)(stm->output_stream, stream_name,
                                               rename_success, stm);

  if (op) {
    operation_wait(stm->context, stm->output_stream, op);
    WRAP(pa_operation_unref)(op);
  }

  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  return CUBEB_OK;
}